

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src,bool before)

{
  string *propertyValue;
  undefined1 local_48 [32];
  const_iterator local_28;
  undefined1 local_19;
  string *psStack_18;
  bool before_local;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  local_19 = before;
  psStack_18 = src;
  src_local = (string *)this;
  if (before) {
    local_48._24_8_ =
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::begin(&this->SourceEntries);
  }
  else {
    local_48._24_8_ =
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::end(&this->SourceEntries);
  }
  __gnu_cxx::
  __normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
  ::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry**>
            ((__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
              *)&local_28,
             (__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_**,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              *)(local_48 + 0x18));
  propertyValue = psStack_18;
  cmMakefile::GetBacktrace((cmMakefile *)local_48);
  local_48._16_8_ = CreateTargetPropertyEntry(propertyValue,(cmListFileBacktrace *)local_48,true);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::insert(&this->SourceEntries,local_28,(value_type *)(local_48 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_48);
  ClearSourcesCache(this);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src, bool before)
{
  this->SourceEntries.insert(
    before ? this->SourceEntries.begin() : this->SourceEntries.end(),
    CreateTargetPropertyEntry(src, this->Makefile->GetBacktrace(), true));
  this->ClearSourcesCache();
}